

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall TextField::draw(TextField *this,RenderTarget *target,RenderStates states)

{
  Transform *right;
  
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    right = sf::Transformable::getTransform(&(this->super_UIComponent).super_Transformable);
    sf::operator*=(&states.transform,right);
    sf::RenderTarget::draw(target,&(this->label).super_Drawable,&states);
    sf::RenderTarget::draw(target,(Drawable *)&this->background,&states);
    sf::RenderTarget::draw(target,&(this->field).super_Drawable,&states);
    if ((this->isEditable == true) && (this->selected == true)) {
      sf::RenderTarget::draw(target,(Drawable *)&this->caret,&states);
    }
  }
  return;
}

Assistant:

void TextField::draw(RenderTarget& target, RenderStates states) const {
    if (visible) {
        states.transform *= getTransform();
        target.draw(label, states);
        target.draw(background, states);
        target.draw(field, states);
        if (isEditable && selected) {
            target.draw(caret, states);
        }
    }
}